

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O1

ChainType __thiscall ArgsManager::GetChainType(ArgsManager *this)

{
  runtime_error *this_00;
  variant_alternative_t<1UL,_variant<ChainType,_basic_string<char,_char_traits<char>,_allocator<char>_>_>_>
  *fmt;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  long in_FS_OFFSET;
  variant<ChainType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  arg;
  string sStack_68;
  _Variadic_union<ChainType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  char local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  GetChainArg_abi_cxx11_
            ((variant<ChainType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_48._M_first,this);
  if (local_28 == '\0') {
    std::__detail::__variant::
    __gen_vtable_impl<std::__detail::__variant::_Multi_array<void_(*)((lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<ChainType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&)>,_std::integer_sequence<unsigned_long,_0UL>_>
    ::__visit_invoke((anon_class_1_0_00000001 *)&sStack_68,
                     (variant<ChainType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_48._M_first);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      return (ChainType)local_48._M_first._M_storage;
    }
  }
  else {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    fmt = std::get<1ul,ChainType,std::__cxx11::string>
                    ((variant<ChainType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_48._M_first);
    tinyformat::format<std::__cxx11::string>
              (&sStack_68,(tinyformat *)"Unknown chain %s.",(char *)fmt,in_RCX);
    std::runtime_error::runtime_error(this_00,(string *)&sStack_68);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  __stack_chk_fail();
}

Assistant:

ChainType ArgsManager::GetChainType() const
{
    std::variant<ChainType, std::string> arg = GetChainArg();
    if (auto* parsed = std::get_if<ChainType>(&arg)) return *parsed;
    throw std::runtime_error(strprintf("Unknown chain %s.", std::get<std::string>(arg)));
}